

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

BOOL __thiscall
Js::GlobalObject::SetExistingRootProperty
          (GlobalObject *this,PropertyId propertyId,Var value,PropertyValueInfo *info,
          BOOL *setAttempted)

{
  BOOL BVar1;
  BOOL BVar2;
  BOOL BVar3;
  int iVar4;
  RecyclableObject *pRVar5;
  RecyclableObject **ppRVar6;
  HostObjectBase **ppHVar7;
  HostObjectBase *pHVar8;
  BOOL hasProperty;
  BOOL hasOwnProperty;
  BOOL *setAttempted_local;
  PropertyValueInfo *info_local;
  Var value_local;
  PropertyId propertyId_local;
  GlobalObject *this_local;
  
  BVar1 = RootObjectBase::HasRootProperty(&this->super_RootObjectBase,propertyId);
  pRVar5 = RecyclableObject::GetPrototype((RecyclableObject *)this);
  BVar2 = Js::JavascriptOperators::HasProperty(pRVar5,propertyId);
  *setAttempted = 1;
  ppRVar6 = Memory::WriteBarrierPtr::operator_cast_to_RecyclableObject__
                      ((WriteBarrierPtr *)&this->directHostObject);
  if (((*ppRVar6 != (RecyclableObject *)0x0) && (BVar1 == 0)) && (BVar2 == 0)) {
    pRVar5 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
    BVar3 = RecyclableObject::HasProperty(pRVar5,propertyId);
    if (BVar3 != 0) {
      pRVar5 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this->directHostObject);
      iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x17])(pRVar5,(ulong)(uint)propertyId,value,0,info);
      if (iVar4 != 0) {
        return 1;
      }
      goto LAB_01090edc;
    }
  }
  ppHVar7 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                      ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
  if (((*ppHVar7 != (HostObjectBase *)0x0) && (BVar1 == 0)) && (BVar2 == 0)) {
    pRVar5 = (RecyclableObject *)
             Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                       (&(this->super_RootObjectBase).hostObject);
    BVar3 = RecyclableObject::HasProperty(pRVar5,propertyId);
    if (BVar3 != 0) {
      pHVar8 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                         (&(this->super_RootObjectBase).hostObject);
      BVar1 = (**(code **)(*(long *)pHVar8 + 0xb8))(pHVar8,propertyId,value,0,0);
      return BVar1;
    }
  }
LAB_01090edc:
  if ((BVar1 == 0) && (BVar2 == 0)) {
    *setAttempted = 0;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ =
         RootObjectBase::SetRootProperty
                   (&this->super_RootObjectBase,propertyId,value,PropertyOperation_None,info);
  }
  return this_local._4_4_;
}

Assistant:

BOOL GlobalObject::SetExistingRootProperty(PropertyId propertyId, Var value, PropertyValueInfo* info, BOOL *setAttempted)
    {
        BOOL hasOwnProperty = __super::HasRootProperty(propertyId);
        BOOL hasProperty = JavascriptOperators::HasProperty(this->GetPrototype(), propertyId);
        *setAttempted = TRUE;

        if (this->directHostObject &&
            !hasOwnProperty &&
            !hasProperty &&
            this->directHostObject->HasProperty(propertyId))
        {
            // directHostObject->HasProperty returns true for things in global collections, however, they are not able to be set.
            // When we call SetProperty we'll return FALSE which means fall back to GlobalObject::SetProperty and shadow our collection
            // object rather than failing the set altogether. See bug Windows Out Of Band Releases 1144780 and linked bugs for details.
            if (this->directHostObject->SetProperty(propertyId, value, PropertyOperation_None, info))
            {
                return TRUE;
            }
        }
        else
            if (this->hostObject &&
                // Consider to revert to the commented line and ignore the prototype chain when direct host is on by default in IE9 mode
                !hasOwnProperty &&
                !hasProperty &&
                this->hostObject->HasProperty(propertyId))
            {
                return this->hostObject->SetProperty(propertyId, value, PropertyOperation_None, NULL);
            }

        if (hasOwnProperty || hasProperty)
        {
            return __super::SetRootProperty(propertyId, value, PropertyOperation_None, info);
        }

        *setAttempted = FALSE;
        return FALSE;
    }